

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::VerifyMarkStack(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  
  amd64_SAVE_REGISTERS(&this->savedThreadContext);
  puVar5 = (undefined8 *)(this->savedThreadContext).registers[0];
  puVar3 = (undefined8 *)GetStackBase();
  if (puVar3 <= puVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2180,"(stackStart > stackTop)","stackStart > stackTop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  for (; puVar5 < puVar3; puVar5 = puVar5 + 1) {
    VerifyMark(this,(void *)0x0,(void *)*puVar5);
  }
  for (lVar6 = 0x12f; lVar6 != 0x13f; lVar6 = lVar6 + 1) {
    VerifyMark(this,(void *)0x0,*(void **)(&this->Cookie + lVar6 * 2));
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkStack()
{
    SAVE_THREAD_CONTEXT();
    void ** stackTop = (void**) this->savedThreadContext.GetStackTop();

    void * stackStart = GetStackBase();
    Assert(stackStart > stackTop);

    for (;stackTop < stackStart; stackTop++)
    {
        void* candidate = *stackTop;
        VerifyMark(nullptr, candidate);
    }

    void** registers = this->savedThreadContext.GetRegisters();
    for (int i = 0; i < SavedRegisterState::NumRegistersToSave; i++)
    {
        VerifyMark(nullptr, registers[i]);
    }
}